

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiTests.cpp
# Opt level: O3

void vkt::api::anon_unknown_1::createApiTests(TestCaseGroup *apiTests)

{
  TestContext *testCtx;
  TestNode *pTVar1;
  TestGroupHelper0 *this;
  string local_68;
  string local_48;
  
  testCtx = (apiTests->super_TestNode).m_testCtx;
  pTVar1 = &createSmokeTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  pTVar1 = &createFeatureInfoTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  pTVar1 = &createDeviceInitializationTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  pTVar1 = &api::createObjectManagementTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  pTVar1 = &createBufferTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"buffer_view","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"BufferView tests","");
  this = (TestGroupHelper0 *)operator_new(0x78);
  TestGroupHelper0::TestGroupHelper0(this,testCtx,&local_48,&local_68,createBufferViewTests);
  tcu::TestNode::addChild(&apiTests->super_TestNode,(TestNode *)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pTVar1 = &createCommandBuffersTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  pTVar1 = &createCopiesAndBlittingTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  pTVar1 = &createImageClearingTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  pTVar1 = &createFillAndUpdateBufferTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  pTVar1 = &createDescriptorPoolTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  pTVar1 = &createNullHandleTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  pTVar1 = &createGranularityQueryTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  pTVar1 = &createMemoryCommitmentTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&apiTests->super_TestNode,pTVar1);
  return;
}

Assistant:

void createApiTests (tcu::TestCaseGroup* apiTests)
{
	tcu::TestContext&	testCtx		= apiTests->getTestContext();

	apiTests->addChild(createSmokeTests					(testCtx));
	apiTests->addChild(api::createFeatureInfoTests		(testCtx));
	apiTests->addChild(createDeviceInitializationTests	(testCtx));
	apiTests->addChild(createObjectManagementTests		(testCtx));
	apiTests->addChild(createBufferTests				(testCtx));
	apiTests->addChild(createTestGroup					(testCtx, "buffer_view", "BufferView tests", createBufferViewTests));
	apiTests->addChild(createCommandBuffersTests		(testCtx));
	apiTests->addChild(createCopiesAndBlittingTests		(testCtx));
	apiTests->addChild(createImageClearingTests			(testCtx));
	apiTests->addChild(createFillAndUpdateBufferTests	(testCtx));
	apiTests->addChild(createDescriptorPoolTests		(testCtx));
	apiTests->addChild(createNullHandleTests			(testCtx));
	apiTests->addChild(createGranularityQueryTests		(testCtx));
	apiTests->addChild(createMemoryCommitmentTests		(testCtx));
}